

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateGeneralTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_4::BindOrderTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BindOrderTestInstance *this)

{
  VkExtent2D *pViewports;
  DeviceInterface *pDVar1;
  VkCommandBuffer_s *pVVar2;
  VkOffset3D offset;
  bool bVar3;
  VkResult result;
  TestContext *this_00;
  TestLog *log_00;
  VkQueue queue_00;
  VkCommandBuffer_s **ppVVar4;
  Handle<(vk::HandleType)18> *pHVar5;
  Buffer *this_01;
  size_type sVar6;
  PixelBufferAccess *pPVar7;
  Image *this_02;
  Allocator *allocator;
  ConstPixelBufferAccess *reference;
  Move<vk::VkCommandBuffer_s_*> *this_03;
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_04;
  float fVar8;
  float fVar9;
  allocator<char> local_1f9;
  string local_1f8;
  undefined4 local_1d8;
  allocator<char> local_1d1;
  string local_1d0;
  void *local_1b0;
  deInt32 local_1a8;
  undefined1 local_1a0 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  int local_158;
  float xCoord;
  int x;
  float yCoord;
  int y;
  int local_13c;
  int local_138;
  deInt32 frameHeight;
  deInt32 frameWidth;
  TextureFormat local_128;
  undefined1 local_120 [8];
  Texture2D referenceFrame;
  undefined8 uStack_c8;
  VkSubmitInfo submitInfo;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  undefined1 auStack_68 [8];
  VkRect2D scissor_2;
  VkRect2D scissor_1;
  VkViewport viewport;
  VkQueue queue;
  TestLog *log;
  BindOrderTestInstance *this_local;
  
  this_00 = Context::getTestContext
                      ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  log_00 = tcu::TestContext::getLog(this_00);
  queue_00 = Context::getUniversalQueue
                       ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  DynamicStateBaseClass::beginRenderPass(&this->super_DynamicStateBaseClass);
  scissor_1.extent.width = 0;
  scissor_1.extent.height = 0;
  scissor_2.extent.width = 0;
  scissor_2.extent.height = 0;
  scissor_1.offset.x = 0x40;
  scissor_1.offset.y = 0x40;
  auStack_68._0_4_ = 0x40;
  auStack_68._4_4_ = 0x40;
  scissor_2.offset.x = 0x40;
  scissor_2.offset.y = 0x40;
  DynamicStateBaseClass::setDynamicRasterizationState
            (&this->super_DynamicStateBaseClass,1.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicBlendState(&this->super_DynamicStateBaseClass,0.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicDepthStencilState
            (&this->super_DynamicStateBaseClass,-1.0,1.0,0xffffffff,0xffffffff,0,0xffffffff,
             0xffffffff,0);
  pViewports = &scissor_1.extent;
  DynamicStateBaseClass::setDynamicViewportState
            (&this->super_DynamicStateBaseClass,1,(VkViewport *)pViewports,
             (VkRect2D *)&scissor_2.extent);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  this_03 = &(this->super_DynamicStateBaseClass).m_cmdBuffer;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar4;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->super_DynamicStateBaseClass).m_pipeline.
                       super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,pVVar2,0,pHVar5->m_internal);
  vertexBuffer.m_internal = 0;
  this_01 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_DynamicStateBaseClass).m_vertexBuffer);
  submitInfo.pSignalSemaphores = (VkSemaphore *)Draw::Buffer::object(this_01);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x58])
            (pDVar1,*ppVVar4,0,1,&submitInfo.pSignalSemaphores,&vertexBuffer);
  DynamicStateBaseClass::setDynamicBlendState(&this->super_DynamicStateBaseClass,0.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicRasterizationState
            (&this->super_DynamicStateBaseClass,1.0,0.0,0.0,0.0);
  DynamicStateBaseClass::setDynamicDepthStencilState
            (&this->super_DynamicStateBaseClass,-1.0,1.0,0xffffffff,0xffffffff,0,0xffffffff,
             0xffffffff,0);
  DynamicStateBaseClass::setDynamicViewportState
            (&this->super_DynamicStateBaseClass,1,(VkViewport *)pViewports,
             (VkRect2D *)&scissor_2.extent);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar4;
  this_04 = &(this->super_DynamicStateBaseClass).m_data;
  sVar6 = std::
          vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
          ::size(this_04);
  (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,pVVar2,sVar6 & 0xffffffff,1,0);
  DynamicStateBaseClass::setDynamicViewportState
            (&this->super_DynamicStateBaseClass,1,(VkViewport *)pViewports,(VkRect2D *)auStack_68);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar4;
  sVar6 = std::
          vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
          ::size(this_04);
  (*pDVar1->_vptr_DeviceInterface[0x59])(pDVar1,pVVar2,sVar6 & 0xffffffff,1,0);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x76])(pDVar1,*ppVVar4);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar4);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_c8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&referenceFrame.m_view.m_levels,0);
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,queue_00,1,&uStack_c8);
  pDVar1 = (this->super_DynamicStateBaseClass).m_vk;
  result = (*pDVar1->_vptr_DeviceInterface[3])(pDVar1,queue_00);
  ::vk::checkResult(result,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/dynamic_state/vktDynamicStateGeneralTests.cpp"
                    ,0xe4);
  local_128 = ::vk::mapVkFormat((this->super_DynamicStateBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D((Texture2D *)local_120,&local_128,0x80,0x80);
  tcu::Texture2D::allocLevel((Texture2D *)local_120,0);
  local_138 = tcu::Texture2D::getWidth((Texture2D *)local_120);
  local_13c = tcu::Texture2D::getHeight((Texture2D *)local_120);
  pPVar7 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_120,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&yCoord,0.0,0.0,0.0,1.0);
  tcu::clear(pPVar7,(Vec4 *)&yCoord);
  for (x = 0; x < local_13c; x = x + 1) {
    fVar8 = (float)x / ((float)local_13c * 0.5) - 1.0;
    for (local_158 = 0; local_158 < local_138; local_158 = local_158 + 1) {
      fVar9 = (float)local_158 / ((float)local_138 * 0.5) - 1.0;
      if (((((-1.0 <= fVar8) && (fVar8 <= 0.0)) && (-1.0 <= fVar9)) && (fVar9 <= 0.0)) ||
         (((0.0 < fVar8 && (fVar8 <= 1.0)) && ((0.0 < fVar9 && (fVar9 < 1.0)))))) {
        pPVar7 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_120,0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&zeroOffset.y,0.0,1.0,0.0,1.0);
        tcu::PixelBufferAccess::setPixel(pPVar7,(Vec4 *)&zeroOffset.y,local_158,x,0);
      }
    }
  }
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_02 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_DynamicStateBaseClass).m_colorTargetImage);
  allocator = Context::getDefaultAllocator
                        ((this->super_DynamicStateBaseClass).super_TestInstance.m_context);
  local_1a8 = zeroOffset.x;
  local_1b0 = renderedFrame.m_data;
  offset.z = zeroOffset.x;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_1a0,this_02,queue_00,allocator,VK_IMAGE_LAYOUT_GENERAL,
             offset,0x80,0x80,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  reference = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_120,0)->
               super_ConstPixelBufferAccess;
  bVar3 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",reference,
                            (ConstPixelBufferAccess *)local_1a0,0.05,COMPARE_LOG_RESULT);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"Image verification passed",&local_1f9);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"Image verification failed",&local_1d1);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
  }
  local_1d8 = 1;
  tcu::Texture2D::~Texture2D((Texture2D *)local_120);
  return __return_storage_ptr__;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		tcu::TestLog &log		= m_context.getTestContext().getLog();
		const vk::VkQueue queue = m_context.getUniversalQueue();

		beginRenderPass();

		// bind states here
		vk::VkViewport viewport = { 0.0f, 0.0f, (float)WIDTH, (float)HEIGHT, 0.0f, 0.0f };
		vk::VkRect2D scissor_1	= { { 0, 0 }, { WIDTH / 2, HEIGHT / 2 } };
		vk::VkRect2D scissor_2	= { { WIDTH / 2, HEIGHT / 2 }, { WIDTH / 2, HEIGHT / 2 } };

		setDynamicRasterizationState();
		setDynamicBlendState();
		setDynamicDepthStencilState();
		setDynamicViewportState(1, &viewport, &scissor_1);

		m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

		const vk::VkDeviceSize vertexBufferOffset = 0;
		const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();
		m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

		// rebind in different order
		setDynamicBlendState();
		setDynamicRasterizationState();
		setDynamicDepthStencilState();

		// bind first state
		setDynamicViewportState(1, &viewport, &scissor_1);
		m_vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_data.size()), 1, 0, 0);

		setDynamicViewportState(1, &viewport, &scissor_2);
		m_vk.cmdDraw(*m_cmdBuffer, static_cast<deUint32>(m_data.size()), 1, 0, 0);

		m_vk.cmdEndRenderPass(*m_cmdBuffer);
		m_vk.endCommandBuffer(*m_cmdBuffer);

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		//validation
		VK_CHECK(m_vk.queueWaitIdle(queue));

		tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
		referenceFrame.allocLevel(0);

		const deInt32 frameWidth = referenceFrame.getWidth();
		const deInt32 frameHeight = referenceFrame.getHeight();

		tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

		for (int y = 0; y < frameHeight; y++)
		{
			const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

			for (int x = 0; x < frameWidth; x++)
			{
				const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

				if ((yCoord >= -1.0f && yCoord <= 0.0f && xCoord >= -1.0f && xCoord <= 0.0f) ||
					(yCoord > 0.0f && yCoord <= 1.0f && xCoord > 0.0f && xCoord < 1.0f))
					referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f), x, y);
			}
		}

		const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
		const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
			vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

		if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
			referenceFrame.getLevel(0), renderedFrame, 0.05f,
			tcu::COMPARE_LOG_RESULT))
		{
			return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Image verification failed");
		}

		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Image verification passed");
	}